

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorseInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::MorseInteractionType::MorseInteractionType
          (MorseInteractionType *this,RealType myD0,RealType myBeta0,RealType myR0,MorseType myType)

{
  undefined4 in_ESI;
  NonBondedInteractionType *in_RDI;
  _func_int **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  
  NonBondedInteractionType::NonBondedInteractionType(in_RDI);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__MorseInteractionType_0046a1f8;
  in_RDI[1]._vptr_NonBondedInteractionType = in_XMM0_Qa;
  in_RDI[1].nbitp.is_LennardJones = (bool)(char)in_XMM1_Qa;
  in_RDI[1].nbitp.is_Morse = (bool)(char)((ulong)in_XMM1_Qa >> 8);
  in_RDI[1].nbitp.is_MAW = (bool)(char)((ulong)in_XMM1_Qa >> 0x10);
  in_RDI[1].nbitp.is_EAMTable = (bool)(char)((ulong)in_XMM1_Qa >> 0x18);
  in_RDI[1].nbitp.is_EAMZhou = (bool)(char)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI[1].nbitp.is_EAMOxides = (bool)(char)((ulong)in_XMM1_Qa >> 0x28);
  in_RDI[1].nbitp.is_SC = (bool)(char)((ulong)in_XMM1_Qa >> 0x30);
  in_RDI[1].nbitp.is_RepulsivePower = (bool)(char)((ulong)in_XMM1_Qa >> 0x38);
  *(undefined8 *)&in_RDI[1].nbitp.is_Mie = in_XMM2_Qa;
  *(undefined4 *)&in_RDI[1].atomTypes_.first = in_ESI;
  NonBondedInteractionType::setMorse(in_RDI);
  return;
}

Assistant:

MorseInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                         MorseType myType) {
      D0              = myD0;
      beta0           = myBeta0;
      r0              = myR0;
      interactionType = myType;
      setMorse();
    }